

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O0

size_t luaS_sizelngstr(size_t len,int kind)

{
  int kind_local;
  size_t len_local;
  
  if (kind == -2) {
    len_local = 0x20;
  }
  else if (kind == -1) {
    len_local = len + 0x21;
  }
  else {
    len_local = 0x30;
  }
  return len_local;
}

Assistant:

size_t luaS_sizelngstr (size_t len, int kind) {
  switch (kind) {
    case LSTRREG:  /* regular long string */
      /* don't need 'falloc'/'ud', but need space for content */
      return offsetof(TString, falloc) + (len + 1) * sizeof(char);
    case LSTRFIX:  /* fixed external long string */
      /* don't need 'falloc'/'ud' */
      return offsetof(TString, falloc);
    default:  /* external long string with deallocation */
      lua_assert(kind == LSTRMEM);
      return sizeof(TString);
  }
}